

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat-message.c
# Opt level: O0

int main(void)

{
  int iVar1;
  size_t sVar2;
  undefined4 uVar3;
  rtosc_arg_t arg;
  midi_t m;
  int32_t r;
  char c;
  char *S;
  double d;
  uint64_t t;
  int64_t h;
  rtosc_blob_t b;
  char *s;
  float f;
  int32_t i;
  uint message_len;
  undefined4 uVar4;
  uint in_stack_fffffffffffffe5c;
  char *testcase;
  char *b_00;
  uint idx;
  char *msg;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 *size_a;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar6;
  undefined4 local_7c;
  undefined4 local_78;
  undefined1 local_71;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  char *local_48;
  char *local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  local_2c = 0;
  local_34 = 0x2a;
  local_38 = 0x3e800000;
  local_40 = "string";
  local_50 = 3;
  local_48 = "string";
  local_58 = 0xffffffffffffff83;
  local_60 = 0x578c;
  local_68 = 0x3fc0000000000000;
  local_70 = "Symbol";
  local_71 = 0x19;
  local_78 = 0x12345678;
  local_7c = 0x45342312;
  uVar3 = 0x19;
  size_a = &local_7c;
  uVar4 = 3;
  testcase = "string";
  b_00 = (char *)0xffffffffffffff83;
  msg = (char *)0x578c;
  iVar1 = 0;
  uVar5 = 0x12345678;
  sVar2 = rtosc_message((char *)0x3fd0000000000000,0x3fc0000000000000,buffer,(char *)0x400,"/dest",
                        "[ifsbhtdScrmTFNI]",0x2a,"string");
  local_30 = (undefined4)sVar2;
  assert_int_eq((int)((ulong)testcase >> 0x20),(int)testcase,
                (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  uVar6 = local_34;
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_int_eq((int)((ulong)testcase >> 0x20),(int)testcase,
                (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_str_eq(msg,b_00,testcase,in_stack_fffffffffffffe5c);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_argument(msg,(uint)((ulong)b_00 >> 0x20));
  assert_str_eq(msg,b_00,testcase,in_stack_fffffffffffffe5c);
  idx = (uint)((ulong)b_00 >> 0x20);
  rtosc_argument(msg,idx);
  assert_char_eq((char)((ulong)testcase >> 0x38),(char)((ulong)testcase >> 0x30),
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  rtosc_argument(msg,idx);
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_argument(msg,idx);
  assert_hex_eq((char *)CONCAT44(uVar6,in_stack_fffffffffffffea0),in_stack_fffffffffffffe98,
                (size_t)size_a,CONCAT44(in_stack_fffffffffffffe8c,uVar5),
                (char *)CONCAT44(in_stack_fffffffffffffe84,uVar3),iVar1);
  rtosc_type(testcase,in_stack_fffffffffffffe5c);
  assert_char_eq((char)((ulong)testcase >> 0x38),(char)((ulong)testcase >> 0x30),
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  rtosc_type(testcase,in_stack_fffffffffffffe5c);
  assert_char_eq((char)((ulong)testcase >> 0x38),(char)((ulong)testcase >> 0x30),
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  rtosc_type(testcase,in_stack_fffffffffffffe5c);
  assert_char_eq((char)((ulong)testcase >> 0x38),(char)((ulong)testcase >> 0x30),
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  rtosc_type(testcase,in_stack_fffffffffffffe5c);
  iVar1 = (int)((ulong)testcase >> 0x20);
  assert_char_eq((char)((ulong)testcase >> 0x38),(char)((ulong)testcase >> 0x30),
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  rtosc_valid_message_p
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,uVar5),
             CONCAT44(in_stack_fffffffffffffe84,uVar3));
  assert_true(iVar1,(char *)CONCAT44(in_stack_fffffffffffffe5c,uVar4),0);
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    unsigned message_len;
    int32_t      i = 42;             //integer
    float        f = 0.25;           //float
    const char  *s = "string";       //string
    rtosc_blob_t b = {3,(uint8_t*)s};//blob
    int64_t      h = -125;           //long integer
    uint64_t     t = 22412;          //timetag
    double       d = 0.125;          //double
    const char  *S = "Symbol";       //symbol
    char         c = 25;             //character
    int32_t      r = 0x12345678;     //RGBA
    midi_t       m = {0x12,0x23,     //midi
                      0x34,0x45};
    //true
    //false
    //nil
    //inf

    message_len = rtosc_message(buffer, 1024, "/dest",
                "[ifsbhtdScrmTFNI]", i,f,s,b.len,b.data,h,t,d,S,c,r,m);

    assert_int_eq(96, message_len,
            "Generating A Message With All Arg Types", __LINE__);


    rtosc_arg_t arg;
    assert_int_eq(i, rtosc_argument(buffer, 0).i,
            "Checking 'i' Argument", __LINE__);
    CHECK(f,f,1);
    assert_str_eq(s, rtosc_argument(buffer, 2).s,
            "Checking 's' Argument", __LINE__);
    CHECK(b.len,b.len,3);
    assert_hex_eq((char*)b.data, (char*)arg.b.data, 3, b.len,
            "Checking 'b.data' Argument", __LINE__);
    CHECK(h,h,4);
    CHECK(t,t,5);
    CHECK(d,d,6);
    assert_str_eq(S,rtosc_argument(buffer, 7).s,
            "Checking 'S' Argument", __LINE__);
    assert_char_eq(c,rtosc_argument(buffer, 8).i,
            "Checking 'c' Argument", __LINE__);
    CHECK(r,i,9);
    CHECK(m,m,10);
    assert_char_eq('T', rtosc_type(buffer,11),
            "Checking 'T' Argument", __LINE__);
    assert_char_eq('F', rtosc_type(buffer,12),
            "Checking 'F' Argument", __LINE__);
    assert_char_eq('N', rtosc_type(buffer,13),
            "Checking 'N' Argument", __LINE__);
    assert_char_eq('I', rtosc_type(buffer,14),
            "Checking 'I' Argument", __LINE__);
    assert_true(rtosc_valid_message_p(buffer, message_len),
            "Verifying Message Is Valid", __LINE__);

    return test_summary();
}